

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O0

FunctionData * __thiscall
inja::FunctionStorage::get(FunctionStorage *this,string_view name,uint num_args)

{
  bool bVar1;
  pointer ppVar2;
  reference pFVar3;
  FunctionData *i;
  const_iterator __end2;
  const_iterator __begin2;
  vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
  *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  _Self local_38;
  const_iterator it;
  uint num_args_local;
  FunctionStorage *this_local;
  string_view name_local;
  
  name_local.data_ = (const_pointer)name.size_;
  this_local = (FunctionStorage *)name.data_;
  it._M_node._4_4_ = num_args;
  nonstd::sv_lite::basic_string_view::operator_cast_to_string
            (&local_58,(basic_string_view *)&this_local);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>_>
       ::find(&this->m_map,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  __range2 = (vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>_>
                ::end(&this->m_map);
  bVar1 = std::operator==(&local_38,(_Self *)&__range2);
  if (!bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>_>
             ::operator->(&local_38);
    __end2 = std::
             vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
             ::begin(&ppVar2->second);
    i = (FunctionData *)
        std::
        vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>
        ::end(&ppVar2->second);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_inja::FunctionStorage::FunctionData_*,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>
                                       *)&i), bVar1) {
      pFVar3 = __gnu_cxx::
               __normal_iterator<const_inja::FunctionStorage::FunctionData_*,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>
               ::operator*(&__end2);
      if (pFVar3->num_args == it._M_node._4_4_) {
        return pFVar3;
      }
      __gnu_cxx::
      __normal_iterator<const_inja::FunctionStorage::FunctionData_*,_std::vector<inja::FunctionStorage::FunctionData,_std::allocator<inja::FunctionStorage::FunctionData>_>_>
      ::operator++(&__end2);
    }
  }
  return (FunctionData *)0x0;
}

Assistant:

const FunctionData* get(nonstd::string_view name, unsigned int num_args) const {
		auto it = m_map.find(static_cast<std::string>(name));
		if (it == m_map.end()) return nullptr;
		for (auto&& i : it->second) {
			if (i.num_args == num_args) return &i;
		}
		return nullptr;
	}